

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

JavascriptArray *
Js::JavascriptArray::Jit_GetArrayForArrayOrObjectWithArray(Var var,bool *isObjectWithArrayRef)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  long local_30;
  INT_PTR vtable;
  JavascriptArray *array;
  bool *isObjectWithArrayRef_local;
  Var var_local;
  
  array = (JavascriptArray *)isObjectWithArrayRef;
  isObjectWithArrayRef_local = (bool *)var;
  if (var == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x259,"(var)","var");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (array == (JavascriptArray *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x25a,"(isObjectWithArrayRef)","isObjectWithArrayRef");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  *(undefined1 *)
   &(array->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = 0;
  bVar2 = VarIs<Js::RecyclableObject>(isObjectWithArrayRef_local);
  if (bVar2) {
    vtable = 0;
    local_30 = VirtualTableInfoBase::GetVirtualTable(isObjectWithArrayRef_local);
    bVar2 = Jit_TryGetArrayForObjectWithArray
                      (isObjectWithArrayRef_local,(bool *)array,&local_30,
                       (JavascriptArray **)&vtable);
    if (bVar2) {
      if ((((local_30 == VirtualTableInfo<Js::JavascriptArray>::Address) ||
           (local_30 == VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptArray>_>::Address)) ||
          (local_30 == VirtualTableInfo<Js::JavascriptNativeIntArray>::Address)) ||
         (((local_30 ==
            VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptNativeIntArray>_>::Address ||
           (local_30 == VirtualTableInfo<Js::JavascriptNativeFloatArray>::Address)) ||
          (local_30 ==
           VirtualTableInfo<Js::CrossSiteObject<Js::JavascriptNativeFloatArray>_>::Address)))) {
        if (vtable == 0) {
          vtable = (INT_PTR)VarTo<Js::JavascriptArray>(isObjectWithArrayRef_local);
        }
        var_local = (Var)vtable;
      }
      else {
        var_local = (Var)0x0;
      }
    }
    else {
      var_local = (Var)0x0;
    }
  }
  else {
    var_local = (Var)0x0;
  }
  return (JavascriptArray *)var_local;
}

Assistant:

JavascriptArray *JavascriptArray::Jit_GetArrayForArrayOrObjectWithArray(const Var var, bool *const isObjectWithArrayRef)
    {
        Assert(var);
        Assert(isObjectWithArrayRef);

        *isObjectWithArrayRef = false;

        if (!VarIs<RecyclableObject>(var))
        {
            return nullptr;
        }

        JavascriptArray *array = nullptr;
        INT_PTR vtable = VirtualTableInfoBase::GetVirtualTable(var);
        if (!Jit_TryGetArrayForObjectWithArray(var, isObjectWithArrayRef, &vtable, &array))
        {
            return nullptr;
        }

        if (vtable != VirtualTableInfo<JavascriptArray>::Address &&
            vtable != VirtualTableInfo<CrossSiteObject<JavascriptArray>>::Address &&
            vtable != VirtualTableInfo<JavascriptNativeIntArray>::Address &&
            vtable != VirtualTableInfo<CrossSiteObject<JavascriptNativeIntArray>>::Address &&
            vtable != VirtualTableInfo<JavascriptNativeFloatArray>::Address &&
            vtable != VirtualTableInfo<CrossSiteObject<JavascriptNativeFloatArray>>::Address)
        {
            return nullptr;
        }

        if (!array)
        {
            array = VarTo<JavascriptArray>(var);
        }
        return array;
    }